

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlator.cc
# Opt level: O3

char * decoder::correlationTypeToString(correlationType t)

{
  if (t < 4) {
    return &DAT_0010c51c + *(int *)(&DAT_0010c51c + (ulong)t * 4);
  }
  return "";
}

Assistant:

const char* correlationTypeToString(correlationType t) {
  switch (t) {
  case LRIT_PHASE_000:
    return "LRIT 0 deg";
  case LRIT_PHASE_180:
    return "LRIT 180 deg";
  case HRIT_PHASE_000:
    return "HRIT 0 deg";
  case HRIT_PHASE_180:
    return "HRIT 180 deg";
  }
  return "";
}